

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O3

void __thiscall cmParseCoberturaCoverage::XMLParser::~XMLParser(XMLParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__XMLParser_0094a928;
  pcVar2 = (this->CurFileName)._M_dataplus._M_p;
  paVar1 = &(this->CurFileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->FilePaths);
  cmXMLParser::~cmXMLParser(&this->super_cmXMLParser);
  operator_delete(this,0x78);
  return;
}

Assistant:

XMLParser(cmCTest* ctest, cmCTestCoverageHandlerContainer& cont)
    : FilePaths{ cont.SourceDir, cont.BinaryDir }
    , CTest(ctest)
    , Coverage(cont)
  {
  }